

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int steedintrap(trap *trap,obj *otmp)

{
  permonst *ppVar1;
  monst *mon;
  byte bVar2;
  boolean bVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *line;
  bool bVar9;
  
  mon = u.usteed;
  iVar7 = 0;
  if (trap == (trap *)0x0 || u.usteed == (monst *)0x0) {
    return 0;
  }
  ppVar1 = (u.usteed)->data;
  bVar2 = trap->field_0x8 & 0x1f;
  (u.usteed)->mx = u.ux;
  mon->my = u.uy;
  if ((u.uprops[0x1e].intrinsic == 0) &&
     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
    bVar9 = false;
  }
  else if (ublindf == (obj *)0x0) {
    bVar9 = true;
  }
  else {
    bVar9 = ublindf->oartifact != '\x1d';
  }
  switch(bVar2) {
  case 1:
    if (otmp == (obj *)0x0) {
      impossible("steed hit by non-existant arrow?");
      return 0;
    }
    iVar6 = 8;
    goto LAB_00264f0c;
  case 2:
switchD_00264e14_caseD_2:
    if (otmp == (obj *)0x0) {
      pcVar8 = "dart";
      if (bVar2 == 0x18) {
        pcVar8 = "shuriken";
      }
      impossible("steed hit by non-existant %s?",pcVar8);
      return 0;
    }
    iVar6 = 7;
LAB_00264f0c:
    iVar7 = 0;
LAB_00264f25:
    bVar3 = thitm(iVar6,mon,otmp,iVar7,'\0');
LAB_00264f30:
    iVar7 = 1;
    break;
  case 3:
  case 4:
  case 5:
  case 7:
  case 9:
  case 10:
    goto switchD_00264e14_caseD_3;
  case 6:
    uVar5 = mt_random();
    iVar7 = (uVar5 & 0xf) + 1;
    iVar6 = 0;
    otmp = (obj *)0x0;
    goto LAB_00264f25;
  case 8:
    if ((((mon->mintrinsics & 4) == 0) && ((ppVar1->mflags1 & 0x400) == 0)) &&
       ((*(uint *)&mon->field_0x60 & 0xc0000) == 0x40000)) {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfff3ffff;
      uVar5 = mt_random();
      mon->mfrozen = (char)uVar5 + (char)(uVar5 / 0x19) * -0x19 + '\x01';
      if (!bVar9) {
        pcVar8 = Monnam(mon);
        line = "%s suddenly falls asleep!";
LAB_00264fcd:
        bVar3 = '\0';
        iVar7 = 1;
        pline(line,pcVar8);
        break;
      }
    }
LAB_0026501b:
    iVar7 = 1;
    bVar3 = '\0';
    break;
  case 0xb:
  case 0xc:
    if (mon->mhp < 1) {
LAB_00264e51:
      iVar7 = 1;
      bVar3 = '\x01';
      break;
    }
    uVar5 = mt_random();
    bVar3 = '\0';
    bVar4 = thitm(0,mon,(obj *)0x0,uVar5 % ((uint)(bVar2 != 0xb) * 4 + 6) + 1,'\0');
    if (bVar4 != '\0') goto LAB_00264e51;
    goto LAB_00264f30;
  default:
    if (bVar2 != 0x17) {
      if (bVar2 != 0x18) {
        return 0;
      }
      goto switchD_00264e14_caseD_2;
    }
    bVar4 = resists_magm(mon);
    bVar3 = '\0';
    iVar7 = 0;
    if (bVar4 == '\0') {
      bVar3 = '\0';
      iVar6 = resist(mon,'\v',0,0);
      iVar7 = 1;
      if (iVar6 == 0) {
        newcham(level,mon,(permonst *)0x0,'\0','\0');
        bVar3 = can_saddle(mon);
        if ((bVar3 != '\0') && (bVar3 = can_ride(mon), bVar3 != '\0')) {
          pcVar8 = x_monnam(mon,(uint)(mon->mnamelth == '\0') * 2,(char *)0x0,8,'\0');
          line = "You have to adjust yourself in the saddle on %s.";
          goto LAB_00264fcd;
        }
        dismount_steed(3);
        goto LAB_0026501b;
      }
    }
  }
  if (bVar3 != '\0') {
    dismount_steed(3);
    iVar7 = 2;
  }
switchD_00264e14_caseD_3:
  return iVar7;
}

Assistant:

static int steedintrap(struct trap *trap, struct obj *otmp)
{
	struct monst *mtmp = u.usteed;
	const struct permonst *mptr;
	int tt;
	boolean in_sight;
	boolean trapkilled = FALSE;
	boolean steedhit = FALSE;

	if (!u.usteed || !trap) return 0;
	mptr = mtmp->data;
	tt = trap->ttyp;
	mtmp->mx = u.ux;
	mtmp->my = u.uy;

	in_sight = !Blind;
	switch (tt) {
		case ARROW_TRAP:
			if (!otmp) {
				impossible("steed hit by non-existant arrow?");
				return 0;
			}
			if (thitm(8, mtmp, otmp, 0, FALSE)) trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case DART_TRAP:
		case SHURIKEN_TRAP:
			if (!otmp) {
				impossible("steed hit by non-existant %s?",
					   tt == SHURIKEN_TRAP ? "shuriken" : "dart");
				return 0;
			}
			if (thitm(7, mtmp, otmp, 0, FALSE)) trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case SLP_GAS_TRAP:
		    if (!resists_sleep(mtmp) && !breathless(mptr) &&
				!mtmp->msleeping && mtmp->mcanmove) {
			    mtmp->mcanmove = 0;
			    mtmp->mfrozen = rnd(25);
			    if (in_sight) {
				pline("%s suddenly falls asleep!",
				      Monnam(mtmp));
			    }
			}
			steedhit = TRUE;
			break;
		case LANDMINE:
			if (thitm(0, mtmp, NULL, rnd(16), FALSE))
			    trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case PIT:
		case SPIKED_PIT:
			if (mtmp->mhp <= 0 ||
				thitm(0, mtmp, NULL,
				      rnd((tt == PIT) ? 6 : 10), FALSE))
			    trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case POLY_TRAP: 
		    if (!resists_magm(mtmp)) {
			if (!resist(mtmp, WAND_CLASS, 0, NOTELL)) {
				newcham(level, mtmp, NULL,
					       FALSE, FALSE);
			if (!can_saddle(mtmp) || !can_ride(mtmp)) {
				dismount_steed(DISMOUNT_POLY);
			} else {
				pline("You have to adjust yourself in the saddle on %s.",
					x_monnam(mtmp,
					 mtmp->mnamelth ? ARTICLE_NONE : ARTICLE_A,
				 	 NULL, SUPPRESS_SADDLE, FALSE));
			}
				
		    }
		    steedhit = TRUE;
		    break;
		default:
			return 0;
	    }
	}
	if (trapkilled) {
		dismount_steed(DISMOUNT_POLY);
		return 2;
	}
	else if (steedhit) return 1;
	else return 0;
}